

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFunctionBlocker.cxx
# Opt level: O2

bool __thiscall
cmFunctionBlocker::IsFunctionBlocked
          (cmFunctionBlocker *this,cmListFileFunction *lff,cmExecutionStatus *status)

{
  uint *puVar1;
  element_type *peVar2;
  pointer pcVar3;
  size_type sVar4;
  cmMakefile *this_00;
  bool bVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ostream *poVar7;
  char *extraout_RDX;
  char *extraout_RDX_00;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_00;
  undefined1 local_280 [8];
  string local_278;
  vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> local_258;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_238;
  cmListFileContext closingContext;
  ostringstream e;
  
  peVar2 = (lff->Impl).
           super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  pcVar3 = (peVar2->LowerCaseName)._M_dataplus._M_p;
  sVar4 = (peVar2->LowerCaseName)._M_string_length;
  iVar6 = (*this->_vptr_cmFunctionBlocker[2])();
  __y._M_len._4_4_ = extraout_var;
  __y._M_len._0_4_ = iVar6;
  __y._M_str = extraout_RDX;
  __x._M_str = pcVar3;
  __x._M_len = sVar4;
  bVar5 = std::operator==(__x,__y);
  if (bVar5) {
    this->ScopeDepth = this->ScopeDepth + 1;
LAB_002f9a09:
    std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::push_back
              (&this->Functions,lff);
    return true;
  }
  peVar2 = (lff->Impl).
           super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  pcVar3 = (peVar2->LowerCaseName)._M_dataplus._M_p;
  sVar4 = (peVar2->LowerCaseName)._M_string_length;
  iVar6 = (*this->_vptr_cmFunctionBlocker[3])(this);
  __y_00._M_len._4_4_ = extraout_var_00;
  __y_00._M_len._0_4_ = iVar6;
  __y_00._M_str = extraout_RDX_00;
  __x_00._M_str = pcVar3;
  __x_00._M_len = sVar4;
  bVar5 = std::operator==(__x_00,__y_00);
  if (!bVar5) goto LAB_002f9a09;
  puVar1 = &this->ScopeDepth;
  *puVar1 = *puVar1 - 1;
  if (*puVar1 != 0) goto LAB_002f9a09;
  this_00 = status->Makefile;
  cmMakefile::RemoveFunctionBlocker((cmMakefile *)local_280);
  if (local_280 != (undefined1  [8])this) {
    __assert_fail("self.get() == this",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmFunctionBlocker.cxx"
                  ,0x19,
                  "bool cmFunctionBlocker::IsFunctionBlocked(const cmListFileFunction &, cmExecutionStatus &)"
                 );
  }
  local_238._M_engaged = false;
  cmListFileContext::FromListFileFunction
            (&closingContext,lff,&(this->StartingContext).FilePath,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_238);
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset(&local_238);
  iVar6 = (*this->_vptr_cmFunctionBlocker[4])(this);
  if (((char)iVar6 == '\0') ||
     (iVar6 = (*this->_vptr_cmFunctionBlocker[5])(this,lff,this_00), (char)iVar6 != '\0')) {
    iVar6 = (*this->_vptr_cmFunctionBlocker[4])(this);
    if (((char)iVar6 != '\0') ||
       (peVar2 = (lff->Impl).
                 super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr,
       (peVar2->Arguments).
       super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
       super__Vector_impl_data._M_start ==
       (peVar2->Arguments).
       super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
       super__Vector_impl_data._M_finish)) goto LAB_002f9be4;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    poVar7 = std::operator<<((ostream *)&e,"A logical block closing on the line\n  ");
    poVar7 = ::operator<<(poVar7,&closingContext);
    std::operator<<(poVar7,"\nhas unexpected arguments.");
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(this_00,AUTHOR_WARNING,(string *)(local_280 + 8));
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    poVar7 = std::operator<<((ostream *)&e,"A logical block opening on the line\n");
    poVar7 = std::operator<<(poVar7,"  ");
    poVar7 = ::operator<<(poVar7,&this->StartingContext);
    poVar7 = std::operator<<(poVar7,"\n");
    poVar7 = std::operator<<(poVar7,"closes on the line\n");
    poVar7 = std::operator<<(poVar7,"  ");
    poVar7 = ::operator<<(poVar7,&closingContext);
    poVar7 = std::operator<<(poVar7,"\n");
    std::operator<<(poVar7,"with mis-matching arguments.");
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(this_00,AUTHOR_WARNING,(string *)(local_280 + 8));
  }
  std::__cxx11::string::~string((string *)(local_280 + 8));
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
LAB_002f9be4:
  local_258.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
  super__Vector_impl_data._M_start =
       (this->Functions).super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_258.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (this->Functions).super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_258.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (this->Functions).super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->Functions).super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Functions).super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Functions).super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar6 = (*this->_vptr_cmFunctionBlocker[6])(this,&local_258,status);
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::~vector(&local_258);
  cmListFileContext::~cmListFileContext(&closingContext);
  if (local_280 == (undefined1  [8])0x0) {
    return (bool)(char)iVar6;
  }
  (*(*(_func_int ***)local_280)[1])();
  return (bool)(char)iVar6;
}

Assistant:

bool cmFunctionBlocker::IsFunctionBlocked(const cmListFileFunction& lff,
                                          cmExecutionStatus& status)
{
  if (lff.LowerCaseName() == this->StartCommandName()) {
    this->ScopeDepth++;
  } else if (lff.LowerCaseName() == this->EndCommandName()) {
    this->ScopeDepth--;
    if (this->ScopeDepth == 0U) {
      cmMakefile& mf = status.GetMakefile();
      auto self = mf.RemoveFunctionBlocker();
      assert(self.get() == this);

      cmListFileContext const& lfc = this->GetStartingContext();
      cmListFileContext closingContext =
        cmListFileContext::FromListFileFunction(lff, lfc.FilePath);
      if (this->EndCommandSupportsArguments() &&
          !this->ArgumentsMatch(lff, mf)) {
        std::ostringstream e;
        /* clang-format off */
        e << "A logical block opening on the line\n"
          << "  " << lfc << "\n"
          << "closes on the line\n"
          << "  " << closingContext << "\n"
          << "with mis-matching arguments.";
        /* clang-format on */
        mf.IssueMessage(MessageType::AUTHOR_WARNING, e.str());
      } else if (!this->EndCommandSupportsArguments() &&
                 !lff.Arguments().empty()) {
        std::ostringstream e;
        /* clang-format off */
        e << "A logical block closing on the line\n"
          "  " << closingContext << "\n"
          "has unexpected arguments.";
        /* clang-format on */
        mf.IssueMessage(MessageType::AUTHOR_WARNING, e.str());
      }

      return this->Replay(std::move(this->Functions), status);
    }
  }

  this->Functions.push_back(lff);
  return true;
}